

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O2

void uv_pipe_connect(uv_connect_t *req,uv_pipe_t *handle,char *name,uv_connect_cb cb)

{
  anon_union_8_2_bf76bca6_for_active_reqs *paVar1;
  int iVar2;
  size_t namelen;
  
  namelen = strlen(name);
  iVar2 = uv_pipe_connect2(req,handle,name,namelen,0,cb);
  if (iVar2 != 0) {
    handle->delayed_error = iVar2;
    handle->connect_req = req;
    req->loop = handle->loop;
    req->type = UV_CONNECT;
    paVar1 = &handle->loop->active_reqs;
    paVar1->count = paVar1->count + 1;
    req->handle = (uv_stream_t *)handle;
    req->cb = cb;
    (req->queue).next = &req->queue;
    (req->queue).prev = &req->queue;
    uv__io_feed(handle->loop,&handle->io_watcher);
    return;
  }
  return;
}

Assistant:

void uv_pipe_connect(uv_connect_t* req,
                    uv_pipe_t* handle,
                    const char* name,
                    uv_connect_cb cb) {
  int err;

  err = uv_pipe_connect2(req, handle, name, strlen(name), 0, cb);

  if (err) {
    handle->delayed_error = err;
    handle->connect_req = req;

    uv__req_init(handle->loop, req, UV_CONNECT);
    req->handle = (uv_stream_t*) handle;
    req->cb = cb;
    uv__queue_init(&req->queue);

    /* Force callback to run on next tick in case of error. */
    uv__io_feed(handle->loop, &handle->io_watcher);
  }
}